

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O0

Var Js::JavascriptProxy::FunctionCallTrap(RecyclableObject *function,CallInfo callInfo,...)

{
  CallInfo CVar1;
  RecyclableObject *pRVar2;
  code *pcVar3;
  ushort uVar4;
  uint uVar5;
  ulong uVar6;
  JavascriptMethod entryPoint;
  undefined8 instance;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  int n;
  CallFlags CVar10;
  BOOL BVar11;
  ScriptContext *pSVar12;
  Var *values;
  undefined4 *puVar13;
  JavascriptProxy *this;
  CallInfo *pCVar14;
  RecyclableObject **ppRVar15;
  ThreadContext *pTVar16;
  FunctionInfo *this_00;
  JavascriptLibrary *this_01;
  JavascriptArray *pJVar17;
  Var newValue;
  bool bVar18;
  CallInfo local_258;
  JavascriptFunction *local_250;
  JavascriptProxy *local_248;
  JavascriptProxy *local_240;
  JavascriptArray *local_238;
  uint32 local_22c;
  Var local_228;
  RecyclableObject *local_220;
  JavascriptMethod local_218;
  Var local_210;
  bool local_201;
  ThreadContext *local_200;
  Arguments local_1f0;
  undefined1 local_1e0 [8];
  AutoReentrancyHandler autoReentrancyHandler_2;
  Var trapResult;
  undefined1 local_1c0 [8];
  Arguments arguments;
  CallInfo calleeInfo;
  Var varArgs [4];
  uint local_17c;
  uint i;
  JavascriptArray *argList;
  undefined1 local_160 [8];
  AutoReentrancyHandler autoReentrancyHandler_1;
  Var aReturnValue;
  undefined1 local_140 [8];
  Arguments arguments_1;
  FunctionInfo *functionInfo;
  CallInfo CStack_120;
  ushort argCount;
  CallInfo calleeInfo_1;
  Var stackArgs [8];
  CallInfo *pCStack_c8;
  uint STACK_ARGS_ALLOCA_THRESHOLD;
  Var *newValues;
  ushort newCount;
  undefined1 local_b0 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  Var newThisObject;
  JavascriptFunction *callMethod;
  RecyclableObject *targetObj;
  RecyclableObject *handlerObj;
  JavascriptProxy *proxy;
  Var newTarget;
  undefined1 local_68 [7];
  bool isNewCall;
  byte local_55;
  uint local_54;
  bool isCtorSuperCall;
  ScriptContext *pSStack_50;
  BOOL hasOverridingNewTarget;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar12 = RecyclableObject::GetScriptContext(function);
  local_200 = ScriptContext::GetThreadContext(pSVar12);
  pSVar12 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(local_200,0xc00,pSVar12,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar7 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar7) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                ,0x837,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar7) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  pSStack_50 = RecyclableObject::GetScriptContext(function);
  bVar7 = Arguments::HasNewTarget((Arguments *)&scriptContext);
  local_54 = (uint)bVar7;
  Arguments::Arguments((Arguments *)local_68,(Arguments *)&scriptContext);
  local_55 = Js::JavascriptOperators::GetAndAssertIsConstructorSuperCall((Arguments *)local_68);
  bVar8 = Arguments::IsNewCall((Arguments *)&scriptContext);
  bVar18 = local_54 != 0;
  local_201 = bVar8 || bVar18;
  bVar7 = local_201;
  if (((ulong)scriptContext & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 1;
    bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                ,0x83e,"(args.Info.Count > 0)",
                                "Should always have implicit \'this\'");
    if (!bVar9) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 0;
  }
  bVar9 = VarIs<Js::JavascriptProxy,Js::RecyclableObject>(function);
  if (!bVar9) {
    CVar10 = Js::operator&((CallFlags)((ulong)scriptContext >> 0x18) &
                           (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|
                            CallFlags_NotUsed|CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|
                           CallFlags_New),CallFlags_New);
    if (CVar10 != CallFlags_None) {
      JavascriptError::ThrowTypeError(pSStack_50,-0x7ff5ec76,L"construct");
    }
    JavascriptError::ThrowTypeError(pSStack_50,-0x7ff5ec76,L"call");
  }
  this = VarTo<Js::JavascriptProxy,Js::RecyclableObject>(function);
  pCVar14 = (CallInfo *)
            Memory::WriteBarrierPtr::operator_cast_to_RecyclableObject__
                      ((WriteBarrierPtr *)&this->handler);
  CVar1 = *pCVar14;
  ppRVar15 = Memory::WriteBarrierPtr::operator_cast_to_RecyclableObject__
                       ((WriteBarrierPtr *)&this->target);
  pRVar2 = *ppRVar15;
  bVar9 = ScriptContext::IsHeapEnumInProgress(pSStack_50);
  if (bVar9) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 1;
    bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                ,0x851,"(!scriptContext->IsHeapEnumInProgress())",
                                "!scriptContext->IsHeapEnumInProgress()");
    if (!bVar9) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 0;
  }
  proxy = this;
  if (local_54 != 0) {
    proxy = *(JavascriptProxy **)
             ((long)args.super_Arguments.Info + (ulong)((uint)function_local & 0xffffff) * 8);
  }
  CVar10 = Js::operator&((CallFlags)((ulong)scriptContext >> 0x18) &
                         (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|
                          CallFlags_NotUsed|CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|
                         CallFlags_New),CallFlags_New);
  if (CVar10 == CallFlags_None) {
    newThisObject = GetMethodHelper(this,0x4e,pSStack_50);
  }
  else {
    newThisObject = GetMethodHelper(this,0x66,pSStack_50);
  }
  bVar9 = JavascriptConversion::IsCallable(pRVar2);
  pCVar14 = &local_258;
  if (!bVar9) {
    JavascriptError::ThrowTypeError(pSStack_50,-0x7ff5ec76,L"call");
  }
  if (newThisObject == (Var)0x0) {
    if (0xfffe < ((uint)scriptContext & 0xffffff)) {
      JavascriptError::ThrowRangeError(pSStack_50,-0x7ff5ec52,(PCWSTR)0x0);
    }
    autoReentrancyHandler.m_savedReentrancySafeOrHandled = false;
    autoReentrancyHandler._9_7_ = 0;
    CVar10 = Js::operator&((CallFlags)((ulong)scriptContext >> 0x18) &
                           (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|
                            CallFlags_NotUsed|CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|
                           CallFlags_New),CallFlags_New);
    if (CVar10 != CallFlags_None) {
      bVar9 = Js::JavascriptOperators::IsConstructor(pRVar2);
      if (!bVar9) {
        JavascriptError::ThrowTypeError(pSStack_50,-0x7ff5ec40,L"construct");
      }
      if (((local_55 & 1) == 0) || (*(long *)args.super_Arguments.Info == 0)) {
        pTVar16 = ScriptContext::GetThreadContext(pSStack_50);
        AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_b0,pTVar16);
        local_210 = Js::JavascriptOperators::NewScObjectNoCtorCommon(this,pSStack_50,false);
        autoReentrancyHandler._8_8_ = local_210;
        AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_b0);
        *(undefined8 *)args.super_Arguments.Info = autoReentrancyHandler._8_8_;
      }
      else {
        autoReentrancyHandler._8_8_ = *(undefined8 *)args.super_Arguments.Info;
      }
    }
    uVar4 = (ushort)scriptContext;
    newValues._2_2_ = uVar4;
    if ((bVar8 || bVar18) && (newValues._2_2_ = uVar4 + 1, newValues._2_2_ == 0)) {
      ::Math::DefaultOverflowPolicy();
    }
    if (newValues._2_2_ < uVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 1;
      bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                  ,0x895,"(newCount >= (ushort)args.Info.Count)",
                                  "newCount >= (ushort)args.Info.Count");
      if (!bVar9) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 0;
    }
    if (newValues._2_2_ < 9) {
      pCStack_c8 = &calleeInfo_1;
    }
    else {
      pTVar16 = ScriptContext::GetThreadContext(pSStack_50);
      ThreadContext::ProbeStack(pTVar16,(ulong)newValues._2_2_ * 8 + 0xc00,pSStack_50,(PVOID)0x0);
      pCVar14 = (CallInfo *)
                ((long)&local_258 - (ulong)((uint)newValues._2_2_ * 8 + 0xf & 0xfffffff0));
      pCStack_c8 = pCVar14;
    }
    uVar6 = (ulong)scriptContext >> 0x18;
    uVar5 = (uint)scriptContext;
    pCVar14[-1] = (CallInfo)0x12f57cc;
    CallInfo::CallInfo(&stack0xfffffffffffffee0,
                       (CallFlags)uVar6 &
                       (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|
                        CallFlags_NotUsed|CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|
                       CallFlags_New),uVar5 & 0xffffff);
    if (bVar8 || bVar18) {
      CVar10 = CStack_120._3_4_;
      pCVar14[-1] = (CallInfo)0x12f57ef;
      CVar10 = operator|(CVar10 & (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|
                                   CallFlags_NotUsed|CallFlags_ExtraArg|CallFlags_Eval|
                                   CallFlags_Value|CallFlags_New),CallFlags_ExtraArg);
      pCVar14[-1] = (CallInfo)0x12f57fb;
      CVar10 = operator|(CVar10,CallFlags_NewTarget);
      CStack_120 = (CallInfo)
                   ((ulong)CStack_120 & 0xffffffff00ffffff | ((ulong)CVar10 & 0xff) << 0x18);
    }
    functionInfo._6_2_ = 0;
    while( true ) {
      uVar4 = (ushort)scriptContext;
      if (uVar4 <= functionInfo._6_2_) break;
      if (newValues._2_2_ < uVar4) {
        AssertCount = AssertCount + 1;
        pCVar14[-1] = (CallInfo)0x12f5883;
        Throw::LogAssert();
        pCVar14[-1] = (CallInfo)0x12f5893;
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 1;
        pCVar14[-1] = (CallInfo)0x12f58b8;
        bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                    ,0x8ac,"(newCount >= ((ushort)args.Info.Count))",
                                    "newCount >= ((ushort)args.Info.Count)");
        if (!bVar8) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        pCVar14[-1] = (CallInfo)0x12f58ce;
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 0;
      }
      if (newValues._2_2_ <= functionInfo._6_2_) {
        AssertCount = AssertCount + 1;
        pCVar14[-1] = (CallInfo)0x12f5904;
        Throw::LogAssert();
        pCVar14[-1] = (CallInfo)0x12f5914;
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 1;
        pCVar14[-1] = (CallInfo)0x12f5939;
        bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                    ,0x8ad,"(argCount < newCount)","argCount < newCount");
        if (!bVar8) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        pCVar14[-1] = (CallInfo)0x12f594f;
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 0;
      }
      if ((ushort)scriptContext <= functionInfo._6_2_) {
        AssertCount = AssertCount + 1;
        pCVar14[-1] = (CallInfo)0x12f598c;
        Throw::LogAssert();
        pCVar14[-1] = (CallInfo)0x12f599c;
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 1;
        pCVar14[-1] = (CallInfo)0x12f59c1;
        bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                    ,0x8ae,"(argCount < (ushort)args.Info.Count)",
                                    "argCount < (ushort)args.Info.Count");
        if (!bVar8) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        pCVar14[-1] = (CallInfo)0x12f59d7;
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 0;
      }
      if (newValues._2_2_ <= functionInfo._6_2_) {
        AssertCount = AssertCount + 1;
        pCVar14[-1] = (CallInfo)0x12f5a1a;
        Throw::LogAssert();
        pCVar14[-1] = (CallInfo)0x12f5a2a;
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 1;
        pCVar14[-1] = (CallInfo)0x12f5a4f;
        bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                    ,0x8b0,"(sizeof(Var*) * argCount < sizeof(void*) * newCount)",
                                    "sizeof(Var*) * argCount < sizeof(void*) * newCount");
        if (!bVar8) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        pCVar14[-1] = (CallInfo)0x12f5a65;
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 0;
      }
      pCStack_c8[functionInfo._6_2_] =
           *(CallInfo *)((long)args.super_Arguments.Info + (ulong)functionInfo._6_2_ * 8);
      functionInfo._6_2_ = functionInfo._6_2_ + 1;
    }
    if (bVar7) {
      if ((uint)newValues._2_2_ != uVar4 + 1) {
        AssertCount = AssertCount + 1;
        pCVar14[-1] = (CallInfo)0x12f5ae7;
        Throw::LogAssert();
        pCVar14[-1] = (CallInfo)0x12f5af7;
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 1;
        pCVar14[-1] = (CallInfo)0x12f5b1c;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                    ,0x8b6,"(newCount == ((ushort)args.Info.Count) + 1)",
                                    "newCount == ((ushort)args.Info.Count) + 1");
        if (!bVar7) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        pCVar14[-1] = (CallInfo)0x12f5b32;
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 0;
      }
      pSVar12 = pSStack_50;
      pCStack_c8[(uint)scriptContext & 0xffffff] = (CallInfo)proxy;
      pCVar14[-1] = (CallInfo)0x12f5b66;
      this_00 = Js::JavascriptOperators::GetConstructorFunctionInfo(pRVar2,pSVar12);
      arguments_1.Values = &this_00->originalEntryPoint;
      if (this_00 != (FunctionInfo *)0x0) {
        pCVar14[-1] = (CallInfo)0x12f5b83;
        bVar7 = FunctionInfo::IsClassConstructor(this_00);
        if (bVar7) {
          *pCStack_c8 = (CallInfo)proxy;
        }
      }
    }
    CVar1 = CStack_120;
    pCVar14[-1] = (CallInfo)0x12f5bc1;
    Arguments::Arguments((Arguments *)local_140,CVar1,(Var *)pCStack_c8);
    pSVar12 = pSStack_50;
    autoReentrancyHandler_1.m_savedReentrancySafeOrHandled = false;
    autoReentrancyHandler_1._9_7_ = 0;
    pCVar14[-1] = (CallInfo)0x12f5bd5;
    pTVar16 = ScriptContext::GetThreadContext(pSVar12);
    pCVar14[-1] = (CallInfo)0x12f5be4;
    AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_160,pTVar16);
    local_220 = pRVar2;
    pCVar14[-1] = (CallInfo)0x12f5bf7;
    local_218 = RecyclableObject::GetEntryPoint(pRVar2);
    pCVar14[-1] = (CallInfo)0x12f5c13;
    Arguments::Arguments((Arguments *)&argList,(Arguments *)local_140);
    entryPoint = local_218;
    pRVar2 = local_220;
    pCVar14[-1] = (CallInfo)0x12f5c31;
    local_228 = JavascriptFunction::CallFunction<true>
                          (pRVar2,entryPoint,(Arguments *)&argList,false);
    autoReentrancyHandler_1._8_8_ = local_228;
    pCVar14[-1] = (CallInfo)0x12f5c54;
    AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_160);
    uVar6 = (ulong)function_local >> 0x18;
    pCVar14[-1] = (CallInfo)0x12f5c6e;
    CVar10 = Js::operator&((CallFlags)uVar6 &
                           (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|
                            CallFlags_NotUsed|CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|
                           CallFlags_New),CallFlags_New);
    instance = autoReentrancyHandler_1._8_8_;
    if (CVar10 != CallFlags_None) {
      pCVar14[-1] = (CallInfo)0x12f5c7f;
      BVar11 = Js::JavascriptOperators::IsObject((Var)instance);
      if (BVar11 == 0) {
        autoReentrancyHandler_1.m_savedReentrancySafeOrHandled =
             autoReentrancyHandler.m_savedReentrancySafeOrHandled;
        autoReentrancyHandler_1._9_7_ = autoReentrancyHandler._9_7_;
      }
    }
    callInfo_local = (CallInfo)autoReentrancyHandler_1._8_8_;
  }
  else {
    this_01 = ScriptContext::GetLibrary(pSStack_50);
    pJVar17 = JavascriptLibrary::CreateArray(this_01,((uint)function_local & 0xffffff) - 1);
    for (local_17c = 1; local_17c < ((uint)function_local & 0xffffff); local_17c = local_17c + 1) {
      local_22c = local_17c - 1;
      local_238 = pJVar17;
      newValue = Arguments::operator[]((Arguments *)&scriptContext,local_17c);
      Js::JavascriptArray::DirectSetItemAt<void*>(local_238,local_22c,newValue);
    }
    CallInfo::CallInfo((CallInfo *)&arguments.Values,CallFlags_Value,4);
    Arguments::Arguments((Arguments *)local_1c0,(CallInfo)arguments.Values,(Var *)&calleeInfo);
    calleeInfo = CVar1;
    CVar10 = Js::operator&(scriptContext._3_4_ &
                           (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|
                            CallFlags_NotUsed|CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|
                           CallFlags_New),CallFlags_New);
    if (CVar10 == CallFlags_None) {
      Arguments::operator[]((Arguments *)&scriptContext,0);
    }
    else {
      bVar7 = Js::JavascriptOperators::IsConstructor(pRVar2);
      if (!bVar7) {
        JavascriptError::ThrowTypeError(pSStack_50,-0x7ff5ec00,(PCWSTR)0x0);
      }
      if (local_54 == 0) {
        if ((local_55 & 1) == 0) {
          local_248 = proxy;
        }
        else {
          local_248 = (JavascriptProxy *)Arguments::operator[]((Arguments *)&scriptContext,0);
        }
        local_240 = local_248;
      }
      else {
        local_240 = proxy;
      }
    }
    autoReentrancyHandler_2.m_savedReentrancySafeOrHandled = false;
    autoReentrancyHandler_2._9_7_ = 0;
    pTVar16 = ScriptContext::GetThreadContext(pSStack_50);
    AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_1e0,pTVar16);
    local_250 = (JavascriptFunction *)newThisObject;
    Arguments::Arguments(&local_1f0,(Arguments *)local_1c0);
    local_258 = (CallInfo)JavascriptFunction::CallFunction(local_250,&local_1f0);
    autoReentrancyHandler_2._8_8_ = local_258;
    AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_1e0);
    CVar10 = Js::operator&(scriptContext._3_4_ &
                           (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|
                            CallFlags_NotUsed|CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|
                           CallFlags_New),CallFlags_New);
    if ((CVar10 != CallFlags_None) &&
       (BVar11 = Js::JavascriptOperators::IsObject((Var)autoReentrancyHandler_2._8_8_), BVar11 == 0)
       ) {
      JavascriptError::ThrowTypeError(pSStack_50,-0x7ff5ea14,L"construct");
    }
    callInfo_local = (CallInfo)autoReentrancyHandler_2._8_8_;
  }
  return (Var)callInfo_local;
}

Assistant:

Var JavascriptProxy::FunctionCallTrap(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        BOOL hasOverridingNewTarget = args.HasNewTarget();
        bool isCtorSuperCall = JavascriptOperators::GetAndAssertIsConstructorSuperCall(args);
        bool isNewCall = args.IsNewCall() || hasOverridingNewTarget;

        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");
        if (!VarIs<JavascriptProxy>(function))
        {
            if (args.Info.Flags & CallFlags_New)
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedFunction, _u("construct"));
            }
            else
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedFunction, _u("call"));
            }
        }

        Var newTarget = nullptr;
        JavascriptProxy* proxy = VarTo<JavascriptProxy>(function);
        Js::RecyclableObject *handlerObj = proxy->handler;
        Js::RecyclableObject *targetObj = proxy->target;

        JavascriptFunction* callMethod;
        Assert(!scriptContext->IsHeapEnumInProgress());

        // To conform with ES6 spec 7.3.13
        if (hasOverridingNewTarget)
        {
            newTarget = args.Values[callInfo.Count];
        }
        else
        {
            newTarget = proxy;
        }

        if (args.Info.Flags & CallFlags_New)
        {
            callMethod = proxy->GetMethodHelper(PropertyIds::construct, scriptContext);
        }
        else
        {
            callMethod = proxy->GetMethodHelper(PropertyIds::apply, scriptContext);
        }
        if (!JavascriptConversion::IsCallable(targetObj))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedFunction, _u("call"));
        }

        if (nullptr == callMethod)
        {
            // newCount is ushort. If args count is greater than or equal to 65535, an integer
            // too many arguments
            if (args.Info.Count >= USHORT_MAX) //check against CallInfo::kMaxCountArgs if newCount is ever made int
            {
                JavascriptError::ThrowRangeError(scriptContext, JSERR_ArgListTooLarge);
            }

            // in [[construct]] case, we don't need to check if the function is a constructor: the function should throw there.
            Var newThisObject = nullptr;
            if (args.Info.Flags & CallFlags_New)
            {
                if (!JavascriptOperators::IsConstructor(targetObj))
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedFunction, _u("construct"));
                }

                // args.Values[0] will be null in the case where NewTarget is initially provided by proxy.
                if (!isCtorSuperCall || !args.Values[0])
                {
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        newThisObject = JavascriptOperators::NewScObjectNoCtorCommon(proxy, scriptContext, false);
                    }
                    END_SAFE_REENTRANT_CALL
                    args.Values[0] = newThisObject;
                }
                else
                {
                    newThisObject = args.Values[0];
                }
            }

            ushort newCount = (ushort)args.Info.Count;
            if (isNewCall)
            {
                newCount++;
                if (!newCount)
                {
                    ::Math::DefaultOverflowPolicy();
                }
            }
            AnalysisAssert(newCount >= (ushort)args.Info.Count);

            Var* newValues;
            const unsigned STACK_ARGS_ALLOCA_THRESHOLD = 8; // Number of stack args we allow before using _alloca
            Var stackArgs[STACK_ARGS_ALLOCA_THRESHOLD];
            if (newCount > STACK_ARGS_ALLOCA_THRESHOLD)
            {
                PROBE_STACK(scriptContext, newCount * sizeof(Var) + Js::Constants::MinStackDefault); // args + function call
                newValues = (Var*)_alloca(newCount * sizeof(Var));
            }
            else
            {
                newValues = stackArgs;
            }

            CallInfo calleeInfo((CallFlags)(args.Info.Flags), args.Info.Count);
            if (isNewCall)
            {
                calleeInfo.Flags = (CallFlags)(calleeInfo.Flags | CallFlags_ExtraArg | CallFlags_NewTarget);
            }

            for (ushort argCount = 0; argCount < (ushort)args.Info.Count; argCount++)
            {
                AnalysisAssert(newCount >= ((ushort)args.Info.Count));
                AnalysisAssert(argCount < newCount);
                AnalysisAssert(argCount < (ushort)args.Info.Count);
                AnalysisAssert(sizeof(Var*) == sizeof(void*));
                AnalysisAssert(sizeof(Var*) * argCount < sizeof(void*) * newCount);
#pragma prefast(suppress:__WARNING_WRITE_OVERRUN, "This is a false positive, and all of the above analysis asserts still didn't convince prefast of that.")
                newValues[argCount] = args.Values[argCount];
            }
            if (isNewCall)
            {
                AnalysisAssert(newCount == ((ushort)args.Info.Count) + 1);
                newValues[args.Info.Count] = newTarget;

                // If the function we're calling is a class constructor, it expects newTarget
                // as the first arg so it knows how to construct "this". (We can leave the
                // extra copy of newTarget at the end of the arguments; it's harmless so
                // there's no need to introduce additional complexity here.)
                FunctionInfo* functionInfo = JavascriptOperators::GetConstructorFunctionInfo(targetObj, scriptContext);
                if (functionInfo && functionInfo->IsClassConstructor())
                {
                    newValues[0] = newTarget;
                }
            }

            Js::Arguments arguments(calleeInfo, newValues);
            Var aReturnValue = nullptr;
            BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
            {
                aReturnValue = JavascriptFunction::CallFunction<true>(targetObj, targetObj->GetEntryPoint(), arguments);
            }
            END_SAFE_REENTRANT_CALL
            // If this is constructor call, return the actual object instead of function result
            if ((callInfo.Flags & CallFlags_New) && !JavascriptOperators::IsObject(aReturnValue))
            {
                aReturnValue = newThisObject;
            }
            return aReturnValue;
        }

        JavascriptArray* argList = scriptContext->GetLibrary()->CreateArray(callInfo.Count - 1);
        for (uint i = 1; i < callInfo.Count; i++)
        {
            argList->DirectSetItemAt(i - 1, args[i]);
        }

        Var varArgs[4];
        CallInfo calleeInfo(CallFlags_Value, 4);
        Js::Arguments arguments(calleeInfo, varArgs);

        varArgs[0] = handlerObj;
        varArgs[1] = targetObj;
        if (args.Info.Flags & CallFlags_New)
        {
            if (!JavascriptOperators::IsConstructor(targetObj))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_NotAConstructor);
            }

            varArgs[2] = argList;
            // 1st preference - overridden newTarget
            // 2nd preference - 'this' in case of super() call
            // 3rd preference - newTarget ( which is same as F)
            varArgs[3] = hasOverridingNewTarget ? newTarget :
                isCtorSuperCall ? args[0] : newTarget;
         }
        else
        {
            varArgs[2] = args[0];
            varArgs[3] = argList;
        }

        Var trapResult = nullptr;
        BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
        {
            trapResult = callMethod->CallFunction(arguments);
        }
        END_SAFE_REENTRANT_CALL
        if (args.Info.Flags & CallFlags_New)
        {
            if (!Js::JavascriptOperators::IsObject(trapResult))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_InconsistentTrapResult, _u("construct"));
            }
        }
        return trapResult;
    }